

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestMultipleExtensionRanges::_InternalSerialize
          (TestMultipleExtensionRanges *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  TestMultipleExtensionRanges *extendee;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestMultipleExtensionRanges *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestMultipleExtensionRanges *this_local;
  
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,target,
                            stream);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMultipleExtensionRanges::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMultipleExtensionRanges& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMultipleExtensionRanges)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMultipleExtensionRanges)
  return target;
}